

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node-translator.c++
# Opt level: O0

void __thiscall
capnp::compiler::NodeTranslator::BrandScope::
compile<capnp::compiler::NodeTranslator::BrandedDecl::compileAsType(capnp::compiler::ErrorReporter&,capnp::schema::Type::Builder)::__2>
          (BrandScope *this,Type *initBrand)

{
  ErrorReporter *errorReporter;
  Builder target;
  bool bVar1;
  size_t sVar2;
  unsigned_long *puVar3;
  BrandScope **ppBVar4;
  BrandedDecl *this_00;
  Range<unsigned_long> RVar5;
  Builder local_1b0;
  Builder local_188;
  uint local_15c;
  Iterator IStack_158;
  uint j;
  Iterator __end0;
  Iterator __begin0;
  Range<unsigned_long> *__range6;
  Builder bindings;
  undefined1 local_100 [8];
  Builder scope;
  Iterator IStack_d0;
  uint i;
  Iterator __end4;
  Iterator __begin4;
  Range<unsigned_long> *__range4;
  undefined1 local_80 [8];
  Builder scopes;
  Own<capnp::compiler::NodeTranslator::BrandScope> *p;
  BrandScope *local_40;
  BrandScope *ptr;
  Vector<capnp::compiler::NodeTranslator::BrandScope_*> levels;
  Type *initBrand_local;
  BrandScope *this_local;
  
  levels.builder.disposer = (ArrayDisposer *)initBrand;
  kj::Vector<capnp::compiler::NodeTranslator::BrandScope_*>::Vector
            ((Vector<capnp::compiler::NodeTranslator::BrandScope_*> *)&ptr);
  local_40 = this;
  while( true ) {
    sVar2 = kj::Array<capnp::compiler::NodeTranslator::BrandedDecl>::size(&local_40->params);
    if ((sVar2 != 0) || (((local_40->inherited & 1U) != 0 && (local_40->leafParamCount != 0)))) {
      kj::Vector<capnp::compiler::NodeTranslator::BrandScope*>::
      add<capnp::compiler::NodeTranslator::BrandScope*&>
                ((Vector<capnp::compiler::NodeTranslator::BrandScope*> *)&ptr,&local_40);
    }
    scopes.builder._32_8_ =
         kj::_::readMaybe<capnp::compiler::NodeTranslator::BrandScope>(&local_40->parent);
    if ((Own<capnp::compiler::NodeTranslator::BrandScope> *)scopes.builder._32_8_ ==
        (Own<capnp::compiler::NodeTranslator::BrandScope> *)0x0) break;
    local_40 = kj::Own::operator_cast_to_BrandScope_((Own *)scopes.builder._32_8_);
  }
  sVar2 = kj::Vector<capnp::compiler::NodeTranslator::BrandScope_*>::size
                    ((Vector<capnp::compiler::NodeTranslator::BrandScope_*> *)&ptr);
  if (sVar2 != 0) {
    kj::
    NoInfer_<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/compiler/node-translator.c++:955:47)>
    ::Type::operator()((Builder *)&__range4,levels.builder.disposer);
    sVar2 = kj::Vector<capnp::compiler::NodeTranslator::BrandScope_*>::size
                      ((Vector<capnp::compiler::NodeTranslator::BrandScope_*> *)&ptr);
    capnp::schema::Brand::Builder::initScopes((Builder *)local_80,(Builder *)&__range4,(uint)sVar2);
    RVar5 = kj::indices<kj::Vector<capnp::compiler::NodeTranslator::BrandScope*>&>
                      ((Vector<capnp::compiler::NodeTranslator::BrandScope_*> *)&ptr);
    __begin4.value = RVar5.begin_;
    __end4 = kj::Range<unsigned_long>::begin((Range<unsigned_long> *)&__begin4);
    IStack_d0 = kj::Range<unsigned_long>::end((Range<unsigned_long> *)&__begin4);
    while (bVar1 = kj::Range<unsigned_long>::Iterator::operator!=(&__end4,&stack0xffffffffffffff30),
          bVar1) {
      puVar3 = kj::Range<unsigned_long>::Iterator::operator*(&__end4);
      scope._builder._36_4_ = SUB84(*puVar3,0);
      List<capnp::schema::Brand::Scope,_(capnp::Kind)3>::Builder::operator[]
                ((Builder *)local_100,(Builder *)local_80,scope._builder._36_4_);
      ppBVar4 = kj::Vector<capnp::compiler::NodeTranslator::BrandScope_*>::operator[]
                          ((Vector<capnp::compiler::NodeTranslator::BrandScope_*> *)&ptr,
                           (ulong)(uint)scope._builder._36_4_);
      capnp::schema::Brand::Scope::Builder::setScopeId((Builder *)local_100,(*ppBVar4)->leafId);
      ppBVar4 = kj::Vector<capnp::compiler::NodeTranslator::BrandScope_*>::operator[]
                          ((Vector<capnp::compiler::NodeTranslator::BrandScope_*> *)&ptr,
                           (ulong)(uint)scope._builder._36_4_);
      if (((*ppBVar4)->inherited & 1U) == 0) {
        ppBVar4 = kj::Vector<capnp::compiler::NodeTranslator::BrandScope_*>::operator[]
                            ((Vector<capnp::compiler::NodeTranslator::BrandScope_*> *)&ptr,
                             (ulong)(uint)scope._builder._36_4_);
        sVar2 = kj::Array<capnp::compiler::NodeTranslator::BrandedDecl>::size(&(*ppBVar4)->params);
        capnp::schema::Brand::Scope::Builder::initBind
                  ((Builder *)&__range6,(Builder *)local_100,(uint)sVar2);
        RVar5 = kj::indices<capnp::List<capnp::schema::Brand::Binding,(capnp::Kind)3>::Builder&>
                          ((Builder *)&__range6);
        __begin0.value = RVar5.begin_;
        __end0 = kj::Range<unsigned_long>::begin((Range<unsigned_long> *)&__begin0);
        IStack_158 = kj::Range<unsigned_long>::end((Range<unsigned_long> *)&__begin0);
        while (bVar1 = kj::Range<unsigned_long>::Iterator::operator!=
                                 (&__end0,&stack0xfffffffffffffea8), bVar1) {
          puVar3 = kj::Range<unsigned_long>::Iterator::operator*(&__end0);
          local_15c = (uint)*puVar3;
          ppBVar4 = kj::Vector<capnp::compiler::NodeTranslator::BrandScope_*>::operator[]
                              ((Vector<capnp::compiler::NodeTranslator::BrandScope_*> *)&ptr,
                               (ulong)(uint)scope._builder._36_4_);
          this_00 = kj::Array<capnp::compiler::NodeTranslator::BrandedDecl>::operator[]
                              (&(*ppBVar4)->params,(ulong)local_15c);
          errorReporter = this->errorReporter;
          List<capnp::schema::Brand::Binding,_(capnp::Kind)3>::Builder::operator[]
                    (&local_1b0,(Builder *)&__range6,local_15c);
          capnp::schema::Brand::Binding::Builder::initType(&local_188,&local_1b0);
          target._builder.capTable = local_188._builder.capTable;
          target._builder.segment = local_188._builder.segment;
          target._builder.data = local_188._builder.data;
          target._builder.pointers = local_188._builder.pointers;
          target._builder.dataSize = local_188._builder.dataSize;
          target._builder.pointerCount = local_188._builder.pointerCount;
          target._builder._38_2_ = local_188._builder._38_2_;
          BrandedDecl::compileAsType(this_00,errorReporter,target);
          kj::Range<unsigned_long>::Iterator::operator++(&__end0);
        }
      }
      else {
        capnp::schema::Brand::Scope::Builder::setInherit((Builder *)local_100);
      }
      kj::Range<unsigned_long>::Iterator::operator++(&__end4);
    }
  }
  kj::Vector<capnp::compiler::NodeTranslator::BrandScope_*>::~Vector
            ((Vector<capnp::compiler::NodeTranslator::BrandScope_*> *)&ptr);
  return;
}

Assistant:

void compile(InitBrandFunc&& initBrand) {
    kj::Vector<BrandScope*> levels;
    BrandScope* ptr = this;
    for (;;) {
      if (ptr->params.size() > 0 || (ptr->inherited && ptr->leafParamCount > 0)) {
        levels.add(ptr);
      }
      KJ_IF_MAYBE(p, ptr->parent) {
        ptr = *p;
      } else {
        break;
      }
    }